

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QUrl __thiscall QFileDialog::directoryUrl(QFileDialog *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  QDir local_40 [8];
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(in_RSI + 8) + 0x2c8) == '\x01') {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0049a7d3:
      __stack_chk_fail();
    }
    QFileDialogPrivate::directory_sys((QFileDialogPrivate *)this);
  }
  else {
    directory((QFileDialog *)local_40);
    QDir::absolutePath();
    QUrl::fromLocalFile((QString *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QDir::~QDir(local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0049a7d3;
  }
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QFileDialog::directoryUrl() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse)
        return d->directory_sys();
    else
        return QUrl::fromLocalFile(directory().absolutePath());
}